

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

int testLearningRateOutOfAllowedRange(void)

{
  bool bVar1;
  NeuralNetwork *nn;
  ostream *poVar2;
  Result res;
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  nn = buildBasicUpdatableNeuralNetworkModel(&m);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (nn,kSgdOptimizer,5.0,0.10000000149011612,1.0);
  CoreML::Model::validate(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/ParameterTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x141);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return (uint)bVar1;
}

Assistant:

int testLearningRateOutOfAllowedRange() {
    
    Specification::Model m;
    
    // basic neural network model without any updatable model parameters.
    auto nn = buildBasicUpdatableNeuralNetworkModel(m);
    
    addLearningRate(nn, Specification::Optimizer::kSgdOptimizer, 5.0f, 0.1f, 1.0f);
    
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}